

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Loggers::configureFromGlobal(char *globalConfigurationFilePath)

{
  undefined *puVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  bool local_6d9;
  bool local_6ab;
  bool local_693;
  string local_640 [32];
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [32];
  string local_5d8 [37];
  byte local_5b3;
  byte local_5b2;
  allocator local_5b1;
  string local_5b0;
  undefined1 local_590 [8];
  anon_class_16_2_58e2ca49 configure;
  Logger *logger;
  stringstream ss;
  ostream local_568 [376];
  undefined1 local_3f0 [8];
  string line;
  stringstream local_3b0 [8];
  stringstream internalInfoStream;
  ostream local_3a0 [392];
  istream local_218 [8];
  ifstream gcfStream;
  char *globalConfigurationFilePath_local;
  
  std::ifstream::ifstream(local_218,globalConfigurationFilePath,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_3b0);
    poVar5 = std::operator<<(local_3a0,"Unable to open global configuration file [");
    poVar5 = std::operator<<(poVar5,globalConfigurationFilePath);
    std::operator<<(poVar5,"] for parsing.");
    poVar5 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb7b);
    poVar5 = std::operator<<(poVar5,") [gcfStream.is_open()");
    poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
    std::__cxx11::stringstream::str();
    poVar5 = std::operator<<(poVar5,(string *)(line.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,"\"");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream(local_3b0);
  }
  std::__cxx11::string::string((string *)local_3f0);
  std::__cxx11::stringstream::stringstream((stringstream *)&logger);
  configure.logger = (Logger **)0x0;
  local_590 = (undefined1  [8])&logger;
  configure.ss = (stringstream *)&configure.logger;
  while (bVar2 = std::ios::good(), (bVar2 & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,(string *)local_3f0);
    el::base::utils::Str::trim((string *)local_3f0);
    bVar3 = Configurations::Parser::isComment((string *)local_3f0);
    if (!bVar3) {
      Configurations::Parser::ignoreComments((string *)local_3f0);
      el::base::utils::Str::trim((string *)local_3f0);
      uVar6 = std::__cxx11::string::size();
      puVar1 = el::base::consts::kConfigurationLoggerId;
      local_5b2 = 0;
      local_5b3 = 0;
      local_693 = false;
      if (2 < uVar6) {
        std::allocator<char>::allocator();
        local_5b2 = 1;
        std::__cxx11::string::string((string *)&local_5b0,puVar1,&local_5b1);
        local_5b3 = 1;
        local_693 = el::base::utils::Str::startsWith((string *)local_3f0,&local_5b0);
      }
      if ((local_5b3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_5b0);
      }
      if ((local_5b2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
      }
      if (local_693 == false) {
        poVar5 = std::operator<<(local_568,(string *)local_3f0);
        std::operator<<(poVar5,"\n");
      }
      else {
        std::__cxx11::stringstream::str();
        uVar4 = std::__cxx11::string::empty();
        local_6ab = (uVar4 & 1) == 0 && configure.logger != (Logger **)0x0;
        std::__cxx11::string::~string(local_5d8);
        if (local_6ab) {
          configureFromGlobal::anon_class_16_2_58e2ca49::operator()
                    ((anon_class_16_2_58e2ca49 *)local_590);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5f8,"",&local_5f9);
        std::__cxx11::stringstream::str((string *)&logger);
        std::__cxx11::string::~string(local_5f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
        std::__cxx11::string::substr((ulong)local_620,(ulong)local_3f0);
        std::__cxx11::string::operator=((string *)local_3f0,local_620);
        std::__cxx11::string::~string(local_620);
        el::base::utils::Str::trim((string *)local_3f0);
        uVar6 = std::__cxx11::string::size();
        if (1 < uVar6) {
          configure.logger = (Logger **)getLogger((string *)local_3f0,true);
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
  uVar4 = std::__cxx11::string::empty();
  local_6d9 = (uVar4 & 1) == 0 && configure.logger != (Logger **)0x0;
  std::__cxx11::string::~string(local_640);
  if (local_6d9) {
    configureFromGlobal::anon_class_16_2_58e2ca49::operator()((anon_class_16_2_58e2ca49 *)local_590)
    ;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&logger);
  std::__cxx11::string::~string((string *)local_3f0);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void Loggers::configureFromGlobal(const char* globalConfigurationFilePath) {
  std::ifstream gcfStream(globalConfigurationFilePath, std::ifstream::in);
  ELPP_ASSERT(gcfStream.is_open(), "Unable to open global configuration file [" << globalConfigurationFilePath
              << "] for parsing.");
  std::string line = std::string();
  std::stringstream ss;
  Logger* logger = nullptr;
  auto configure = [&](void) {
    ELPP_INTERNAL_INFO(8, "Configuring logger: '" << logger->id() << "' with configurations \n" << ss.str()
                       << "\n--------------");
    Configurations c;
    c.parseFromText(ss.str());
    logger->configure(c);
  };
  while (gcfStream.good()) {
    std::getline(gcfStream, line);
    ELPP_INTERNAL_INFO(1, "Parsing line: " << line);
    base::utils::Str::trim(line);
    if (Configurations::Parser::isComment(line)) continue;
    Configurations::Parser::ignoreComments(&line);
    base::utils::Str::trim(line);
    if (line.size() > 2 && base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLoggerId))) {
      if (!ss.str().empty() && logger != nullptr) {
        configure();
      }
      ss.str(std::string(""));
      line = line.substr(2);
      base::utils::Str::trim(line);
      if (line.size() > 1) {
        ELPP_INTERNAL_INFO(1, "Getting logger: '" << line << "'");
        logger = getLogger(line);
      }
    } else {
      ss << line << "\n";
    }
  }
  if (!ss.str().empty() && logger != nullptr) {
    configure();
  }
}